

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vectors.h
# Opt level: O0

void __thiscall Vector<Fad<double>_>::resize(Vector<Fad<double>_> *this,int ssize)

{
  undefined1 auVar1 [16];
  char *__s;
  ulong uVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_00;
  size_type *psVar3;
  int in_ESI;
  int *in_RDI;
  allocator<char> *__a;
  Fad<double> *in_stack_ffffffffffffff70;
  Vector<Fad<double>_> *in_stack_ffffffffffffff80;
  size_type *psVar4;
  size_type *local_78;
  allocator<char> local_41;
  string local_40 [52];
  int local_c;
  
  if (in_ESI == 0) {
    if (*in_RDI != 0) {
      destroy(in_stack_ffffffffffffff80);
    }
  }
  else {
    local_c = in_ESI;
    if (*in_RDI != 0) {
      destroy(in_stack_ffffffffffffff80);
    }
    *in_RDI = local_c;
    __s = (char *)(long)*in_RDI;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = __s;
    uVar2 = SUB168(auVar1 * ZEXT816(0x20),0);
    __a = (allocator<char> *)(uVar2 + 8);
    if (SUB168(auVar1 * ZEXT816(0x20),8) != 0 || 0xfffffffffffffff7 < uVar2) {
      __a = (allocator<char> *)0xffffffffffffffff;
    }
    this_00 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              operator_new__((ulong)__a);
    *(char **)this_00 = __s;
    psVar3 = &this_00->_M_string_length;
    if (__s != (char *)0x0) {
      psVar4 = psVar3 + (long)__s * 4;
      local_78 = psVar3;
      do {
        Fad<double>::Fad(in_stack_ffffffffffffff70);
        local_78 = local_78 + 4;
      } while (local_78 != psVar4);
    }
    *(size_type **)(in_RDI + 2) = psVar3;
    if (*(long *)(in_RDI + 2) == 0) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(this_00,__s,__a);
      ::error((string *)0x1eae48a);
      std::__cxx11::string::~string(local_40);
      std::allocator<char>::~allocator(&local_41);
    }
  }
  return;
}

Assistant:

inline void Vector< T >::resize(int ssize)
{
#ifdef CHECK_SIZE
    if ( ssize <0 ) error("Vector<>::reserve(), negative size");
#endif

    if ( ssize != 0){
      if ( num_elts != 0) destroy();

      num_elts = ssize;
      ptr_to_data = new T[num_elts];              
      
      if ( ptr_to_data == 0 ) error("Vector<>::reserve(), not enough memory");

    }
    else
      if ( num_elts != 0) destroy();

#ifdef DEBUG
    fprintf(stderr,"Vector<>::reserve()         |                   | adr =  %x \n", ptr_to_data);
#endif
}